

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpparser.c
# Opt level: O2

parse_status_t parser_parse_responseline(http_parser_t *parser)

{
  char *pcVar1;
  int *piVar2;
  int *piVar3;
  int *piVar4;
  char cVar5;
  parse_status_t pVar6;
  int iVar7;
  ushort **ppuVar8;
  long lVar9;
  char *buf;
  memptr line;
  
  if (parser->position == POS_RESPONSE_LINE) {
    pVar6 = skip_blank_lines(&parser->scanner);
    if ((pVar6 == PARSE_OK) &&
       (pVar6 = match(&parser->scanner,"%ihttp%w/%w%L%c",&line), pVar6 == PARSE_OK)) {
      cVar5 = line.buf[line.length];
      line.buf[line.length] = '\0';
      piVar2 = &(parser->msg).major_version;
      piVar3 = &(parser->msg).minor_version;
      piVar4 = &(parser->msg).status_code;
      iVar7 = __isoc99_sscanf(line.buf,"%d . %d %d",piVar2,piVar3,piVar4);
      line.buf[line.length] = cVar5;
      pVar6 = PARSE_FAILURE;
      if ((iVar7 == 3) && (((-1 < *piVar2 && (-1 < *piVar3)) && (-1 < *piVar4)))) {
        ppuVar8 = __ctype_b_loc();
        buf = line.buf;
        for (iVar7 = 0; iVar7 != 3; iVar7 = iVar7 + 1) {
          pcVar1 = buf + -1;
          do {
            buf = pcVar1;
            pcVar1 = buf + 1;
          } while ((*(byte *)((long)*ppuVar8 + (long)buf[1] * 2 + 1) & 8) == 0);
          do {
            pcVar1 = buf + 1;
            buf = buf + 1;
          } while ((*(byte *)((long)*ppuVar8 + (long)*pcVar1 * 2 + 1) & 8) != 0);
        }
        cVar5 = *buf;
        if ((cVar5 == ' ') || (cVar5 == '\t')) {
          lVar9 = (long)buf - (long)line.buf;
          while ((cVar5 == ' ' || (cVar5 == '\t'))) {
            pcVar1 = buf + 1;
            buf = buf + 1;
            lVar9 = lVar9 + 1;
            cVar5 = *pcVar1;
          }
          iVar7 = membuffer_assign(&(parser->msg).status_msg,buf,line.length - lVar9);
          if (iVar7 == 0) {
            parser->position = POS_HEADERS;
            pVar6 = PARSE_OK;
          }
          else {
            parser->http_error_code = 500;
          }
        }
      }
    }
    return pVar6;
  }
  __assert_fail("parser->position == POS_RESPONSE_LINE",".upnp/src/genlib/net/http/httpparser.c",
                0x56d,"parse_status_t parser_parse_responseline(http_parser_t *)");
}

Assistant:

parse_status_t parser_parse_responseline(http_parser_t *parser)
{
	parse_status_t status;
	http_message_t *hmsg = &parser->msg;
	memptr line;
	char save_char;
	int num_scanned;
	int i;
	size_t n;
	char *p;

	assert(parser->position == POS_RESPONSE_LINE);

	status = skip_blank_lines(&parser->scanner);
	if (status != (parse_status_t)PARSE_OK)
		return status;
	/* response line */
	/*status = match( &parser->scanner, "%ihttp%w/%w%d\t.\t%d\t%d\t%L%c", */
	/*  &hmsg->major_version, &hmsg->minor_version, */
	/*  &hmsg->status_code, &hmsg->status_msg ); */
	status = match(&parser->scanner, "%ihttp%w/%w%L%c", &line);
	if (status != (parse_status_t)PARSE_OK)
		return status;
	save_char = line.buf[line.length];
	line.buf[line.length] = '\0'; /* null-terminate */
				      /* scan http version and ret code */
#ifdef _WIN32
	num_scanned = sscanf_s(line.buf,
#else
	num_scanned = sscanf(line.buf,
#endif
		"%d . %d %d",
		&hmsg->major_version,
		&hmsg->minor_version,
		&hmsg->status_code);
	line.buf[line.length] = save_char; /* restore */
	if (num_scanned != 3 || hmsg->major_version < 0 ||
		hmsg->minor_version < 0 || hmsg->status_code < 0)
		/* bad response line */
		return PARSE_FAILURE;
	/* point to status msg */
	p = line.buf;
	/* skip 3 ints */
	for (i = 0; i < 3; i++) {
		/* go to start of num */
		while (!isdigit(*p))
			p++;
		/* skip int */
		while (isdigit(*p))
			p++;
	}
	/* whitespace must exist after status code */
	if (*p != ' ' && *p != '\t')
		return PARSE_FAILURE;
	/* skip whitespace */
	while (*p == ' ' || *p == '\t')
		p++;
	/* now, p is at start of status msg */
	n = line.length - ((size_t)p - (size_t)line.buf);
	if (membuffer_assign(&hmsg->status_msg, p, n) != 0) {
		/* out of mem */
		parser->http_error_code = HTTP_INTERNAL_SERVER_ERROR;
		return PARSE_FAILURE;
	}
	parser->position = POS_HEADERS; /* move to headers */

	return PARSE_OK;
}